

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmldate.c
# Opt level: O2

datetime_t EBML_DateTime(ebml_date *Element)

{
  datetime_t dVar1;
  bool_t bVar2;
  
  bVar2 = Node_IsPartOf(Element,0x54444245);
  if (bVar2 != 0) {
    if ((Element->Base).bValueIsSet == '\0') {
      dVar1 = 0;
    }
    else {
      dVar1 = (datetime_t)(Element->Value / 1000000000);
    }
    return dVar1;
  }
  __assert_fail("Node_IsPartOf(Element,EBML_DATE_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmldate.c"
                ,0xb,"datetime_t EBML_DateTime(const ebml_date *)");
}

Assistant:

datetime_t EBML_DateTime(const ebml_date *Element)
{
    assert(Node_IsPartOf(Element,EBML_DATE_CLASS));
    if (!Element->Base.bValueIsSet)
        return 0;
    return (datetime_t)Scale32(Element->Value,1,1000000000); // nanoseconds to seconds
}